

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

bool __thiscall PArray::ReadValue(PArray *this,FArchive *ar,void *addr)

{
  uint uVar1;
  DWORD DVar2;
  uint uVar3;
  int iVar4;
  undefined8 in_RAX;
  byte bVar5;
  uint uVar6;
  BYTE tag;
  
  tag = (BYTE)((ulong)in_RAX >> 0x38);
  FArchive::operator<<(ar,&tag);
  if (tag == 0xf) {
    DVar2 = FArchive::ReadCount(ar);
    bVar5 = 0;
    uVar6 = 0;
    while( true ) {
      uVar1 = this->ElementCount;
      uVar3 = uVar1;
      if (DVar2 < uVar1) {
        uVar3 = DVar2;
      }
      if (uVar3 <= uVar6) break;
      iVar4 = (*(this->ElementType->super_DObject)._vptr_DObject[8])(this->ElementType,ar,addr);
      bVar5 = bVar5 | (byte)iVar4;
      addr = (void *)((long)addr + (ulong)this->ElementSize);
      uVar6 = uVar6 + 1;
    }
    if (uVar6 < uVar1) {
      DPrintf(2,"Array on disk (%u) is bigger than in memory (%u)\n",(ulong)DVar2);
      for (; uVar6 < this->ElementCount; uVar6 = uVar6 + 1) {
        PType::SkipValue(ar);
      }
    }
  }
  else {
    PType::SkipValue(ar,(uint)tag);
    bVar5 = 0;
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool PArray::ReadValue(FArchive &ar, void *addr) const
{
	bool readsomething = false;
	BYTE tag;

	ar << tag;
	if (tag == VAL_Array)
	{
		unsigned count = ar.ReadCount();
		unsigned i;
		BYTE *addrb = (BYTE *)addr;
		for (i = 0; i < MIN(count, ElementCount); ++i)
		{
			readsomething |= ElementType->ReadValue(ar, addrb);
			addrb += ElementSize;
		}
		if (i < ElementCount)
		{
			DPrintf(DMSG_WARNING, "Array on disk (%u) is bigger than in memory (%u)\n",
				count, ElementCount);
			for (; i < ElementCount; ++i)
			{
				SkipValue(ar);
			}
		}
		return readsomething;
	}
	SkipValue(ar, tag);
	return false;
}